

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O3

void predict_iforest(float *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,float *Xc,size_t *Xc_ind,size_t *Xc_indptr,float *Xr,
                    size_t *Xr_ind,size_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    size_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pSVar1;
  pointer puVar2;
  ulong uVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ExtIsoForest *pEVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  undefined8 uVar12;
  ScoringMetric SVar13;
  long lVar14;
  PredictionData<float,_unsigned_long> *extraout_RDX;
  PredictionData<float,_unsigned_long> *extraout_RDX_00;
  PredictionData<float,_unsigned_long> *extraout_RDX_01;
  undefined7 in_register_00000011;
  PredictionData<float,_unsigned_long> *prediction_data;
  size_t *psVar15;
  double *pdVar16;
  uint uVar17;
  undefined7 uVar18;
  pointer pvVar19;
  pointer pvVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  PredictionData<float,_unsigned_long> *pPVar29;
  double dStack_f0;
  PredictionData<float,_unsigned_long> *pPStack_e8;
  undefined8 uStack_e0;
  double dStack_d8;
  double dStack_d0;
  long lStack_c0;
  long alStack_b8 [2];
  ulong uStack_a8;
  int iStack_9c;
  int *piStack_98;
  PredictionData<float,_unsigned_long> PStack_90;
  
  prediction_data =
       (PredictionData<float,_unsigned_long> *)CONCAT71(in_register_00000011,is_col_major);
  if (nrows == 0) {
    return;
  }
  PStack_90.nrows = nrows;
  PStack_90.Xc_ind = Xc_ind;
  PStack_90.Xc_indptr = Xc_indptr;
  PStack_90.Xr = Xr;
  PStack_90.Xr_ind = Xr_ind;
  iStack_9c = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    iStack_9c = nthreads;
  }
  PStack_90.Xr_indptr = Xr_indptr;
  piStack_98 = categ_data;
  PStack_90.numeric_data = numeric_data;
  PStack_90.categ_data = categ_data;
  PStack_90.is_col_major = is_col_major;
  PStack_90.ncols_numeric = ncols_numeric;
  PStack_90.ncols_categ = ncols_categ;
  PStack_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (size_t *)0x0) {
    batched_csc_predict<float,unsigned_long>
              (&PStack_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
    prediction_data = extraout_RDX;
LAB_00147f71:
    if (model_outputs != (IsoForest *)0x0) {
      pvVar20 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar11 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00147f7d;
    }
    lVar14 = ((long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar28._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar28._0_8_ = lVar14;
    auVar28._12_4_ = 0x45300000;
    dStack_d0 = auVar28._8_8_ - 1.9342813113834067e+25;
    dStack_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    pPVar29 = (PredictionData<float,_unsigned_long> *)(model_outputs_ext->exp_avg_depth * dStack_d8)
    ;
    SVar13 = model_outputs_ext->scoring_metric;
    bVar23 = SVar13 == Density;
    bVar24 = SVar13 == BoxedRatio;
    uVar17 = (uint)(SVar13 == BoxedDensity);
    uStack_e0 = CONCAT44(uStack_e0._4_4_,(int)CONCAT71((int7)((ulong)prediction_data >> 8),1));
LAB_0014808f:
    bVar25 = SVar13 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (size_t *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (size_t *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        pvVar10 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nrows == 1 || !is_col_major) {
          prediction_data = (PredictionData<float,_unsigned_long> *)(nrows * 8);
          lVar14 = 0;
          dStack_d8 = 0.0;
          pPStack_e8 = prediction_data;
          do {
            dStack_f0 = 0.0;
            pvVar19 = pvVar10;
            if ((long)pvVar8 - (long)pvVar10 != 0) {
              uVar3 = ((long)pvVar8 - (long)pvVar10 >> 3) * -0x5555555555555555;
              lVar22 = 0;
              uVar21 = 0;
              psVar15 = tree_num;
              pdVar16 = per_tree_depths;
              do {
                puVar5 = psVar15;
                if (tree_num == (size_t *)0x0) {
                  puVar5 = tree_num;
                }
                pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
                if (per_tree_depths == (double *)0x0) {
                  pdVar4 = (double *)0x0;
                }
                traverse_hplane_fast_rowmajor<float,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar19->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar22),
                           model_outputs_ext,
                           PStack_90.numeric_data + PStack_90.ncols_numeric * (long)dStack_d8,
                           &dStack_f0,puVar5,pdVar4,(size_t)dStack_d8);
                uVar21 = uVar21 + 1;
                pvVar19 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar10 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar3 = ((long)pvVar10 - (long)pvVar19 >> 3) * -0x5555555555555555;
                psVar15 = (size_t *)((long)psVar15 + (long)pPStack_e8);
                pdVar16 = pdVar16 + 1;
                lVar22 = lVar22 + 0x18;
                prediction_data = pPStack_e8;
              } while (uVar21 < uVar3);
            }
            output_depths[(long)dStack_d8] = dStack_f0;
            dStack_d8 = (double)((long)dStack_d8 + 1);
            lVar14 = lVar14 + 8;
            pvVar8 = pvVar10;
            pvVar10 = pvVar19;
          } while (dStack_d8 != (double)nrows);
        }
        else {
          pPStack_e8 = (PredictionData<float,_unsigned_long> *)(nrows * 8);
          lVar14 = 0;
          prediction_data = &PStack_90;
          dStack_d8 = 0.0;
          do {
            dStack_f0 = 0.0;
            pvVar19 = pvVar10;
            if ((long)pvVar8 - (long)pvVar10 != 0) {
              uVar3 = ((long)pvVar8 - (long)pvVar10 >> 3) * -0x5555555555555555;
              lVar22 = 0;
              uVar21 = 0;
              pdVar16 = per_tree_depths;
              psVar15 = tree_num;
              do {
                puVar5 = psVar15;
                if (tree_num == (size_t *)0x0) {
                  puVar5 = tree_num;
                }
                pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
                if (per_tree_depths == (double *)0x0) {
                  pdVar4 = (double *)0x0;
                }
                traverse_hplane_fast_colmajor<PredictionData<float,unsigned_long>,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar19->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar22),
                           model_outputs_ext,prediction_data,&dStack_f0,puVar5,pdVar4,
                           (size_t)dStack_d8);
                uVar21 = uVar21 + 1;
                pvVar19 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar10 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar3 = ((long)pvVar10 - (long)pvVar19 >> 3) * -0x5555555555555555;
                psVar15 = (size_t *)((long)psVar15 + (long)pPStack_e8);
                pdVar16 = pdVar16 + 1;
                lVar22 = lVar22 + 0x18;
              } while (uVar21 < uVar3);
            }
            output_depths[(long)dStack_d8] = dStack_f0;
            dStack_d8 = (double)((long)dStack_d8 + 1);
            lVar14 = lVar14 + 8;
            pvVar8 = pvVar10;
            pvVar10 = pvVar19;
          } while (dStack_d8 != (double)nrows);
        }
      }
      else {
        pPStack_e8 = (PredictionData<float,_unsigned_long> *)(nrows * 8);
        lVar14 = 0;
        dStack_d8 = 0.0;
        pvVar10 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          dStack_f0 = 0.0;
          pvVar19 = pvVar8;
          if ((long)pvVar10 - (long)pvVar8 != 0) {
            uVar3 = ((long)pvVar10 - (long)pvVar8 >> 3) * -0x5555555555555555;
            lVar22 = 0;
            uVar21 = 0;
            pdVar16 = per_tree_depths;
            psVar15 = tree_num;
            do {
              puVar5 = psVar15;
              if (tree_num == (size_t *)0x0) {
                puVar5 = tree_num;
              }
              pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
              if (per_tree_depths == (double *)0x0) {
                pdVar4 = (double *)0x0;
              }
              traverse_hplane<PredictionData<float,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar19->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar22),
                         model_outputs_ext,&PStack_90,&dStack_f0,
                         (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                         (ImputedData<unsigned_long,_double> *)0x0,puVar5,pdVar4,(size_t)dStack_d8);
              uVar21 = uVar21 + 1;
              pvVar19 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar8 = (model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              uVar3 = ((long)pvVar8 - (long)pvVar19 >> 3) * -0x5555555555555555;
              psVar15 = (size_t *)((long)psVar15 + (long)pPStack_e8);
              pdVar16 = pdVar16 + 1;
              lVar22 = lVar22 + 0x18;
            } while (uVar21 < uVar3);
          }
          output_depths[(long)dStack_d8] = dStack_f0;
          dStack_d8 = (double)((long)dStack_d8 + 1);
          lVar14 = lVar14 + 8;
          pvVar10 = pvVar8;
          prediction_data = (PredictionData<float,_unsigned_long> *)per_tree_depths;
          pvVar8 = pvVar19;
        } while (dStack_d8 != (double)nrows);
      }
      goto LAB_00147f71;
    }
    if (model_outputs->missing_action != Fail) {
LAB_00147c15:
      lStack_c0 = 0;
      uStack_a8 = nrows * 8;
      pPStack_e8 = (PredictionData<float,_unsigned_long> *)0x0;
      uVar3 = 0;
      sVar6 = 0;
      do {
        if ((uVar3 & 1) == 0) {
          pvVar20 = (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = (long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20;
          uStack_e0 = uVar3;
          if (lVar14 == 0) {
            dVar26 = 0.0;
          }
          else {
            uVar3 = (lVar14 >> 3) * -0x5555555555555555;
            dVar26 = 0.0;
            lVar14 = 0;
            uVar21 = 0;
            psVar15 = tree_num;
            pdVar16 = per_tree_depths;
            do {
              puVar5 = psVar15;
              if (tree_num == (size_t *)0x0) {
                puVar5 = tree_num;
              }
              pdVar4 = (double *)(uVar3 * (long)pPStack_e8 + (long)pdVar16);
              if (per_tree_depths == (double *)0x0) {
                pdVar4 = (double *)0x0;
              }
              dStack_d8 = dVar26;
              dVar26 = traverse_itree<PredictionData<float,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                                 ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                  ((long)&(pvVar20->
                                          super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                          _M_impl + lVar14),model_outputs,&PStack_90,
                                  (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                  (ImputedData<unsigned_long,_double> *)0x0,0.0,sVar6,puVar5,pdVar4,
                                  0);
              dVar26 = dStack_d8 + dVar26;
              uVar21 = uVar21 + 1;
              pvVar20 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar3 = ((long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20 >> 3) *
                      -0x5555555555555555;
              psVar15 = (size_t *)((long)psVar15 + uStack_a8);
              pdVar16 = pdVar16 + 1;
              lVar14 = lVar14 + 0x18;
              prediction_data = extraout_RDX_00;
            } while (uVar21 < uVar3);
          }
          output_depths[sVar6] = dVar26;
          uVar3 = uStack_e0;
        }
        sVar6 = sVar6 + 1;
        pPStack_e8 = (PredictionData<float,_unsigned_long> *)((long)pPStack_e8 + 8);
      } while (sVar6 != nrows);
      if ((uVar3 & 1) != 0) {
        alStack_b8[0] = lStack_c0;
        if (lStack_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_addref();
        }
        uVar12 = std::rethrow_exception((exception_ptr)alStack_b8);
        if (lStack_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        _Unwind_Resume(uVar12);
      }
      if (lStack_c0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
        prediction_data = extraout_RDX_01;
      }
      goto LAB_00147f71;
    }
    if (model_outputs->new_cat_action == Weighted) {
      if (((Xc_indptr == (size_t *)0x0) && (Xr_indptr == (size_t *)0x0)) &&
         (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
      goto LAB_00148531;
      goto LAB_00147c15;
    }
    if (Xc_indptr != (size_t *)0x0 || Xr_indptr != (size_t *)0x0) goto LAB_00147c15;
LAB_00148531:
    if (model_outputs->has_range_penalty != false) goto LAB_00147c15;
    pvVar20 = (model_outputs->trees).
              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (model_outputs->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      lVar14 = 0;
      dStack_d8 = 0.0;
      do {
        pvVar11 = pvVar20;
        dStack_f0 = 0.0;
        pvVar20 = pvVar11;
        if ((long)pvVar9 - (long)pvVar11 != 0) {
          uVar3 = ((long)pvVar9 - (long)pvVar11 >> 3) * -0x5555555555555555;
          lVar22 = 0;
          uVar21 = 0;
          psVar15 = tree_num;
          pdVar16 = per_tree_depths;
          do {
            puVar5 = psVar15;
            if (tree_num == (size_t *)0x0) {
              puVar5 = tree_num;
            }
            pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar4 = (double *)0x0;
            }
            traverse_itree_fast<float,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar20->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar22),model_outputs,
                       PStack_90.numeric_data + PStack_90.ncols_numeric * (long)dStack_d8,&dStack_f0
                       ,puVar5,pdVar4,(size_t)dStack_d8);
            uVar21 = uVar21 + 1;
            pvVar20 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar3 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
            psVar15 = psVar15 + nrows;
            pdVar16 = pdVar16 + 1;
            lVar22 = lVar22 + 0x18;
          } while (uVar21 < uVar3);
        }
        output_depths[(long)dStack_d8] = dStack_f0;
        dStack_d8 = (double)((long)dStack_d8 + 1);
        lVar14 = lVar14 + 8;
        pvVar9 = pvVar11;
      } while (dStack_d8 != (double)nrows);
    }
    else {
      lVar14 = 0;
      dStack_d8 = 0.0;
      do {
        pvVar11 = pvVar20;
        dStack_f0 = 0.0;
        pvVar20 = pvVar11;
        if ((long)pvVar9 - (long)pvVar11 != 0) {
          uVar3 = ((long)pvVar9 - (long)pvVar11 >> 3) * -0x5555555555555555;
          lVar22 = 0;
          uVar21 = 0;
          pdVar16 = per_tree_depths;
          psVar15 = tree_num;
          do {
            puVar5 = psVar15;
            if (tree_num == (size_t *)0x0) {
              puVar5 = tree_num;
            }
            pdVar4 = (double *)(uVar3 * lVar14 + (long)pdVar16);
            if (per_tree_depths == (double *)0x0) {
              pdVar4 = (double *)0x0;
            }
            traverse_itree_no_recurse<PredictionData<float,unsigned_long>,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar20->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar22),model_outputs,
                       &PStack_90,&dStack_f0,puVar5,pdVar4,(size_t)dStack_d8);
            uVar21 = uVar21 + 1;
            pvVar20 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar3 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
            psVar15 = psVar15 + nrows;
            pdVar16 = pdVar16 + 1;
            lVar22 = lVar22 + 0x18;
          } while (uVar21 < uVar3);
        }
        output_depths[(long)dStack_d8] = dStack_f0;
        dStack_d8 = (double)((long)dStack_d8 + 1);
        lVar14 = lVar14 + 8;
        pvVar9 = pvVar11;
      } while (dStack_d8 != (double)nrows);
    }
LAB_00147f7d:
    lVar14 = ((long)pvVar11 - (long)pvVar20 >> 3) * -0x5555555555555555;
    auVar27._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar27._0_8_ = lVar14;
    auVar27._12_4_ = 0x45300000;
    dStack_d0 = auVar27._8_8_ - 1.9342813113834067e+25;
    dStack_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    pPVar29 = (PredictionData<float,_unsigned_long> *)(model_outputs->exp_avg_depth * dStack_d8);
    SVar13 = model_outputs->scoring_metric;
    bVar23 = SVar13 == Density;
    uVar18 = (undefined7)((ulong)model_outputs >> 8);
    if (bVar23) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar24 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar23 = true;
LAB_00148078:
        uVar17 = (uint)CONCAT71(uVar18,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_00148082:
        SVar13 = model_outputs_ext->scoring_metric;
        uStack_e0 = (ulong)uStack_e0._4_4_ << 0x20;
        goto LAB_0014808f;
      }
      bVar24 = false;
LAB_001480b9:
      bVar25 = SVar13 == BoxedDensity2;
      uVar17 = 0;
LAB_001480c2:
      uStack_e0 = (ulong)uStack_e0._4_4_ << 0x20;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar23 = model_outputs_ext->scoring_metric == Density;
        bVar24 = true;
        if (SVar13 == BoxedRatio) goto LAB_00148078;
        bVar24 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar17 = (uint)CONCAT71(uVar18,1);
        if ((SVar13 == BoxedDensity) ||
           (uVar17 = (uint)CONCAT71(uVar18,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar13 != BoxedDensity2)) goto LAB_00148082;
        bVar25 = true;
        goto LAB_001480c2;
      }
      bVar24 = SVar13 == BoxedRatio;
      if (SVar13 != BoxedDensity) goto LAB_001480b9;
      uVar17 = (uint)CONCAT71(uVar18,1);
      bVar23 = false;
      uStack_e0 = (ulong)uStack_e0._4_4_ << 0x20;
      bVar25 = false;
    }
  }
  uStack_a8 = CONCAT44(uStack_a8._4_4_,uVar17);
  if (standardize) {
    if (bVar23 || bVar25) {
      sVar6 = 0;
      do {
        output_depths[sVar6] = output_depths[sVar6] / -dStack_d8;
        sVar6 = sVar6 + 1;
      } while (nrows != sVar6);
    }
    else if ((char)uVar17 == '\0') {
      if (bVar24) {
        sVar6 = 0;
        do {
          output_depths[sVar6] = output_depths[sVar6] / dStack_d8;
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
      }
      else {
        sVar6 = 0;
        pPStack_e8 = pPVar29;
        do {
          dVar26 = exp2(-output_depths[sVar6] / (double)pPStack_e8);
          output_depths[sVar6] = dVar26;
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
      }
    }
    else {
      sVar6 = 0;
      do {
        dVar26 = exp(output_depths[sVar6] / dStack_d8);
        output_depths[sVar6] = -dVar26;
        sVar6 = sVar6 + 1;
      } while (nrows != sVar6);
    }
  }
  else if ((bVar23 || (char)uVar17 != '\0') || bVar25) {
    sVar6 = 0;
    do {
      dVar26 = exp(output_depths[sVar6] / dStack_d8);
      output_depths[sVar6] = dVar26;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  else if (bVar24) {
    sVar6 = 0;
    do {
      output_depths[sVar6] = output_depths[sVar6] / -dStack_d8;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  else {
    sVar6 = 0;
    do {
      output_depths[sVar6] = output_depths[sVar6] / dStack_d8;
      sVar6 = sVar6 + 1;
    } while (nrows != sVar6);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar23 || (uStack_a8 & 1) != 0) || bVar25)) {
    pEVar7 = (ExtIsoForest *)model_outputs;
    if ((char)uStack_e0 != '\0') {
      pEVar7 = model_outputs_ext;
    }
    lVar14 = nrows * -0x5555555555555555 *
             ((long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar7->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar14 != 0) {
      lVar22 = 0;
      do {
        dVar26 = exp(per_tree_depths[lVar22]);
        per_tree_depths[lVar22] = dVar26;
        lVar22 = lVar22 + 1;
      } while (lVar14 - lVar22 != 0);
    }
  }
  if (tree_num == (size_t *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar1 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar1 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_00148319:
    remap_terminal_trees<PredictionData<float,unsigned_long>,unsigned_long>
              (model_outputs,model_outputs_ext,&PStack_90,tree_num,iStack_9c);
  }
  else {
    if ((char)uStack_e0 == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar14 = (long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (piStack_98 != (int *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_00148319;
    }
    else {
      lVar14 = (long)(model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar14 != 0) {
      lVar22 = (lVar14 >> 3) * -0x5555555555555555;
      lVar14 = 0;
      do {
        puVar2 = pSVar1[lVar14].terminal_node_mappings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          tree_num[sVar6] = puVar2[tree_num[sVar6]];
          sVar6 = sVar6 + 1;
        } while (nrows != sVar6);
        lVar14 = lVar14 + 1;
        tree_num = tree_num + nrows;
      } while (lVar14 != lVar22 + (ulong)(lVar22 == 0));
    }
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}